

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsstyle.cpp
# Opt level: O0

void __thiscall QWindowsStyle::polish(QWindowsStyle *this,QApplication *app)

{
  undefined8 uVar1;
  int iVar2;
  QWindowsStylePrivate *this_00;
  QStyle *pQVar3;
  QColor *pQVar4;
  QObject *in_RSI;
  QCommonStyle *in_RDI;
  long in_FS_OFFSET;
  QPalette *palette;
  QWindowsStylePrivate *d;
  QApplication *in_stack_ffffffffffffffb8;
  QPalette *this_01;
  QPalette local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QCommonStyle::polish(in_RDI,in_stack_ffffffffffffffb8);
  this_00 = d_func((QWindowsStyle *)0x4c84ee);
  pQVar3 = QStyle::proxy((QStyle *)this_00);
  iVar2 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x29,0,0);
  if ((iVar2 == 0) && (in_RSI != (QObject *)0x0)) {
    QObject::installEventFilter(in_RSI);
  }
  this_01 = &local_18;
  QGuiApplication::palette();
  QPalette::highlight((QPalette *)0x4c8565);
  pQVar4 = QBrush::color((QBrush *)0x4c856d);
  uVar1 = *(undefined8 *)pQVar4;
  *(undefined8 *)((long)&(this_00->activeGradientCaptionColor).ct + 2) =
       *(undefined8 *)((long)&pQVar4->ct + 2);
  *(undefined8 *)&this_00->activeGradientCaptionColor = uVar1;
  uVar1 = *(undefined8 *)&this_00->activeGradientCaptionColor;
  *(undefined8 *)((long)&(this_00->activeCaptionColor).ct + 2) =
       *(undefined8 *)((long)&(this_00->activeGradientCaptionColor).ct + 2);
  *(undefined8 *)&this_00->activeCaptionColor = uVar1;
  QPalette::dark((QPalette *)0x4c85b5);
  pQVar4 = QBrush::color((QBrush *)0x4c85bd);
  uVar1 = *(undefined8 *)pQVar4;
  *(undefined8 *)((long)&(this_00->inactiveGradientCaptionColor).ct + 2) =
       *(undefined8 *)((long)&pQVar4->ct + 2);
  *(undefined8 *)&this_00->inactiveGradientCaptionColor = uVar1;
  uVar1 = *(undefined8 *)&this_00->inactiveGradientCaptionColor;
  *(undefined8 *)((long)&(this_00->inactiveCaptionColor).ct + 2) =
       *(undefined8 *)((long)&(this_00->inactiveGradientCaptionColor).ct + 2);
  *(undefined8 *)&this_00->inactiveCaptionColor = uVar1;
  QPalette::window((QPalette *)0x4c8605);
  pQVar4 = QBrush::color((QBrush *)0x4c860d);
  uVar1 = *(undefined8 *)pQVar4;
  *(undefined8 *)((long)&(this_00->inactiveCaptionText).ct + 2) =
       *(undefined8 *)((long)&pQVar4->ct + 2);
  *(undefined8 *)&this_00->inactiveCaptionText = uVar1;
  QPalette::~QPalette(this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWindowsStyle::polish(QApplication *app)
{
    QCommonStyle::polish(app);
    QWindowsStylePrivate *d = const_cast<QWindowsStylePrivate*>(d_func());
    // We only need the overhead when shortcuts are sometimes hidden
    if (!proxy()->styleHint(SH_UnderlineShortcut, nullptr) && app)
        app->installEventFilter(this);

    const auto &palette = QGuiApplication::palette();
    d->activeGradientCaptionColor = palette.highlight().color();
    d->activeCaptionColor = d->activeGradientCaptionColor;
    d->inactiveGradientCaptionColor = palette.dark().color();
    d->inactiveCaptionColor = d->inactiveGradientCaptionColor;
    d->inactiveCaptionText = palette.window().color();

#if defined(Q_OS_WIN) //fetch native title bar colors
    if (app->desktopSettingsAware()){
        DWORD activeCaption = GetSysColor(COLOR_ACTIVECAPTION);
        DWORD gradientActiveCaption = GetSysColor(COLOR_GRADIENTACTIVECAPTION);
        DWORD inactiveCaption = GetSysColor(COLOR_INACTIVECAPTION);
        DWORD gradientInactiveCaption = GetSysColor(COLOR_GRADIENTINACTIVECAPTION);
        DWORD inactiveCaptionText = GetSysColor(COLOR_INACTIVECAPTIONTEXT);
        d->activeCaptionColor = colorref2qrgb(activeCaption);
        d->activeGradientCaptionColor = colorref2qrgb(gradientActiveCaption);
        d->inactiveCaptionColor = colorref2qrgb(inactiveCaption);
        d->inactiveGradientCaptionColor = colorref2qrgb(gradientInactiveCaption);
        d->inactiveCaptionText = colorref2qrgb(inactiveCaptionText);
    }
#endif
}